

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetetra.cpp
# Opt level: O0

void pzshape::TPZShapeTetra::ShapeGenerating
               (TPZVec<double> *pt,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double *pdVar14;
  double dVar15;
  size_t in_stack_00000138;
  char *in_stack_00000140;
  REAL mult [15];
  int xj;
  int is3;
  int is2_1;
  int is1_1;
  int is2;
  int is1;
  int nsnodes;
  int is;
  int in_stack_fffffffffffffd1c;
  undefined8 in_stack_fffffffffffffd20;
  double dVar16;
  double in_stack_fffffffffffffd30;
  double in_stack_fffffffffffffd38;
  TPZFMatrix<double> *in_stack_fffffffffffffd40;
  double local_b8 [16];
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  for (local_1c = 4; local_1c < 0xf; local_1c = local_1c + 1) {
    local_20 = pztopology::TPZTetrahedron::NSideNodes(local_1c);
    if (local_20 == 2) {
      local_24 = pztopology::TPZTetrahedron::SideNodeLocId
                           ((int)in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
      local_28 = pztopology::TPZTetrahedron::SideNodeLocId
                           ((int)in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar16 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar1 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      *pdVar14 = dVar16 * dVar1;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar16 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar1 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar2 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar3 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      *pdVar14 = dVar16 * dVar1 + dVar2 * dVar3;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar16 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar1 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar2 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar3 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      *pdVar14 = dVar16 * dVar1 + dVar2 * dVar3;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar16 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar1 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar2 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar3 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      *pdVar14 = dVar16 * dVar1 + dVar2 * dVar3;
    }
    else if (local_20 == 3) {
      local_2c = pztopology::TPZTetrahedron::SideNodeLocId
                           ((int)in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
      local_30 = pztopology::TPZTetrahedron::SideNodeLocId
                           ((int)in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
      local_34 = pztopology::TPZTetrahedron::SideNodeLocId
                           ((int)in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar16 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar1 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar2 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      *pdVar14 = dVar16 * dVar1 * dVar2;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar16 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar1 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar2 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar3 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar4 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar5 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar6 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar7 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar8 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      *pdVar14 = dVar6 * dVar7 * dVar8 + dVar16 * dVar1 * dVar2 + dVar3 * dVar4 * dVar5;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar16 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar1 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar2 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar3 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar4 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar5 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar6 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar7 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar8 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      *pdVar14 = dVar6 * dVar7 * dVar8 + dVar16 * dVar1 * dVar2 + dVar3 * dVar4 * dVar5;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar16 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar1 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar2 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar3 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar4 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar5 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar6 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar7 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar8 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      *pdVar14 = dVar6 * dVar7 * dVar8 + dVar16 * dVar1 * dVar2 + dVar3 * dVar4 * dVar5;
    }
    else if (local_20 == 4) {
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar16 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar1 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar2 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      dVar3 = *pdVar14;
      pdVar14 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                           (int64_t)in_stack_fffffffffffffd30);
      *pdVar14 = dVar16 * dVar1 * dVar2 * dVar3;
      for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                             (int64_t)in_stack_fffffffffffffd30);
        in_stack_fffffffffffffd40 = (TPZFMatrix<double> *)*pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                             (int64_t)in_stack_fffffffffffffd30);
        dVar15 = (double)in_stack_fffffffffffffd40 * *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                             (int64_t)in_stack_fffffffffffffd30);
        dVar16 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                             (int64_t)in_stack_fffffffffffffd30);
        dVar1 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                             (int64_t)in_stack_fffffffffffffd30);
        dVar2 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                             (int64_t)in_stack_fffffffffffffd30);
        dVar3 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                             (int64_t)in_stack_fffffffffffffd30);
        dVar4 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                             (int64_t)in_stack_fffffffffffffd30);
        dVar5 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                             (int64_t)in_stack_fffffffffffffd30);
        dVar6 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                             (int64_t)in_stack_fffffffffffffd30);
        dVar7 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                             (int64_t)in_stack_fffffffffffffd30);
        dVar8 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                             (int64_t)in_stack_fffffffffffffd30);
        dVar9 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                             (int64_t)in_stack_fffffffffffffd30);
        dVar10 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                             (int64_t)in_stack_fffffffffffffd30);
        dVar11 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                             (int64_t)in_stack_fffffffffffffd30);
        dVar12 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                             (int64_t)in_stack_fffffffffffffd30);
        dVar13 = *pdVar14;
        pdVar14 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                             (int64_t)in_stack_fffffffffffffd30);
        *pdVar14 = dVar10 * dVar11 * dVar12 * dVar13 +
                   dVar6 * dVar7 * dVar8 * dVar9 +
                   dVar15 * dVar16 * dVar1 + dVar2 * dVar3 * dVar4 * dVar5;
      }
    }
    else {
      pzinternal::DebugStopImpl(in_stack_00000140,in_stack_00000138);
    }
  }
  memcpy(local_b8,&DAT_020980a0,0x78);
  for (local_1c = 4; local_1c < 0xf; local_1c = local_1c + 1) {
    dVar16 = local_b8[local_1c];
    pdVar14 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                         (int64_t)in_stack_fffffffffffffd30);
    *pdVar14 = dVar16 * *pdVar14;
    dVar16 = local_b8[local_1c];
    pdVar14 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                         (int64_t)in_stack_fffffffffffffd30);
    *pdVar14 = dVar16 * *pdVar14;
    in_stack_fffffffffffffd30 = local_b8[local_1c];
    pdVar14 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                         (int64_t)in_stack_fffffffffffffd30);
    *pdVar14 = in_stack_fffffffffffffd30 * *pdVar14;
    in_stack_fffffffffffffd38 = local_b8[local_1c];
    pdVar14 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                         (int64_t)in_stack_fffffffffffffd30);
    *pdVar14 = in_stack_fffffffffffffd38 * *pdVar14;
  }
  return;
}

Assistant:

void TPZShapeTetra::ShapeGenerating(const TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
	{
		int is;
		// 6 ribs
		for(is=4; is<NSides; is++)
		{
			int nsnodes = NSideNodes(is);
			switch(nsnodes)
			{
				case 2:
				{
					int is1 = SideNodeLocId(is,0);
					int is2 = SideNodeLocId(is,1);
					phi(is,0) = phi(is1,0)*phi(is2,0);
					dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
					dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
					dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
				}
					break;
				case 3:
				{
					//int face = is-10;
					int is1 = SideNodeLocId(is,0); //ShapeFaceId[face][0]; 
					int is2 = SideNodeLocId(is,1); //ShapeFaceId[face][1]; 
					int is3 = SideNodeLocId(is,2); //ShapeFaceId[face][2]; 
					phi(is,0) = phi(is1,0)*phi(is2,0)*phi(is3,0);
					dphi(0,is) = dphi(0,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(0,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(0,is3);
					dphi(1,is) = dphi(1,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(1,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(1,is3);
					dphi(2,is) = dphi(2,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(2,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(2,is3);
				}
					break;
				case 4:
				{
					phi(is,0) = phi(0,0)*phi(1,0)*phi(2,0)*phi(3,0);
					for(int xj=0;xj<3;xj++) {
						dphi(xj,is) = dphi(xj,0)* phi(1 ,0)* phi(2 ,0)* phi(3 ,0) +
						phi(0, 0)*dphi(xj,1)* phi(2 ,0)* phi(3 ,0) +
						phi(0, 0)* phi(1 ,0)*dphi(xj,2)* phi(3 ,0) +
						phi(0, 0)* phi(1 ,0)* phi(2 ,0)*dphi(xj,3);
					}
				}
					break;
					
				default:
					DebugStop();
			}
		}

		REAL mult[] = {1.,1.,1.,1.,4.,4.,4.,4.,4.,4.,27.,27.,27.,27.,54.};
		for(is=4;is<NSides; is++)
		{
			phi(is,0) *= mult[is];
			dphi(0,is) *= mult[is];
			dphi(1,is) *= mult[is];
			dphi(2,is) *= mult[is];
		}
		 
	}